

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_buffer.h
# Opt level: O0

V4x32U __thiscall
highwayhash::AVX2::Insert4AboveMask(AVX2 *this,uint32_t bytes4,V4x32U *mask,V4x32U *prev)

{
  V128<unsigned_int> VVar1;
  V4x32U VVar2;
  V128<unsigned_int> local_48;
  V128<unsigned_int> local_38;
  V4x32U *local_28;
  V4x32U *prev_local;
  V4x32U *mask_local;
  AVX2 *pAStack_10;
  uint32_t bytes4_local;
  
  local_28 = prev;
  prev_local = mask;
  mask_local._4_4_ = bytes4;
  pAStack_10 = this;
  V128<unsigned_int>::V128(&local_48,bytes4);
  AndNot<unsigned_int>(&local_38,mask);
  VVar1 = operator|(this,prev,&local_38);
  VVar2.v_[1] = VVar1.v_[1];
  VVar2.v_[0] = (longlong)this;
  return (V4x32U)VVar2.v_;
}

Assistant:

HH_INLINE V4x32U Insert4AboveMask(const uint32_t bytes4, const V4x32U& mask,
                                  const V4x32U& prev) {
  // There is no 128-bit shift by a variable count. Using shuffle_epi8 with a
  // control mask requires a table lookup. We know the shift count is a
  // multiple of 4 bytes, so we can broadcastd_epi32 and clear all lanes except
  // those where mask != 0. This works because any upper output lanes need not
  // be zero.
  return prev | AndNot(mask, V4x32U(bytes4));
}